

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LzmaEnc_Construct(CLzmaEnc *p)

{
  UInt32 i;
  Byte *pBVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int j;
  int iVar7;
  long lVar8;
  CLzmaEncProps props;
  
  (p->rc).bufBase = (Byte *)0x0;
  (p->rc).outStream = (ISeqOutStream *)0x0;
  MatchFinder_Construct(&p->matchFinderBase);
  props.level = 5;
  props.dictSize = 0;
  props.reduceSize._0_4_ = 0xffffffff;
  props.reduceSize._4_4_ = 0xffffffff;
  props.lc = -1;
  props.lp = -1;
  props.pb = -1;
  props.algo = -1;
  props.fb = -1;
  props.btMode = -1;
  props.numHashBytes = -1;
  props.mc = 0;
  props.writeEndMark = 0;
  props.numThreads = -1;
  LzmaEnc_SetProps(p,&props);
  p->g_FastPos[0] = '\0';
  p->g_FastPos[1] = '\x01';
  pBVar1 = p->g_FastPos + 2;
  for (uVar2 = 2; (int)uVar2 != 0x1a; uVar2 = (ulong)((int)uVar2 + 1)) {
    lVar8 = 1L << ((char)(uVar2 >> 1) - 1U & 0x3f);
    for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
      pBVar1[lVar4] = (Byte)uVar2;
    }
    pBVar1 = pBVar1 + lVar8;
  }
  for (uVar2 = 8; uVar2 < 0x800; uVar2 = uVar2 + 0x10) {
    iVar3 = 0;
    uVar6 = uVar2 & 0xffffffff;
    for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
      iVar3 = iVar3 * 2;
      for (uVar5 = (int)uVar6 * (int)uVar6; uVar6 = (ulong)uVar5, 0xffff < uVar5; uVar5 = uVar5 >> 1
          ) {
        iVar3 = iVar3 + 1;
      }
    }
    p->ProbPrices[uVar2 >> 4] = 0xa1 - iVar3;
  }
  p->litProbs = (UInt16 *)0x0;
  (p->saveState).litProbs = (UInt16 *)0x0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc *p)
{
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
  
  #ifndef _7ZIP_ST
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
  #endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

  #ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
  #endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = NULL;
  p->saveState.litProbs = NULL;
}